

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRenderer.cpp
# Opt level: O2

void __thiscall
myvk::ImGuiRenderer::CmdDrawPipeline
          (ImGuiRenderer *this,Ptr<CommandBuffer> *command_buffer,uint32_t current_frame)

{
  __shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *this_00;
  _Vector_base<VkRect2D,_std::allocator<VkRect2D>_> *this_01;
  undefined8 uVar1;
  pointer psVar2;
  ulong uVar3;
  ImDrawList *pIVar4;
  ImDrawCmd *pIVar5;
  code *pcVar6;
  CommandBuffer *this_02;
  int iVar7;
  undefined4 extraout_var;
  element_type *peVar8;
  undefined4 in_ECX;
  long lVar9;
  void *__dest;
  __shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *this_03;
  ImDrawData *pIVar10;
  long lVar11;
  void *__dest_00;
  int i;
  int iVar12;
  int iVar14;
  undefined1 auVar13 [16];
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  initializer_list<VkRect2D> __l;
  int local_e8;
  int local_e4;
  allocator_type local_d9;
  Ptr<CommandBuffer> *local_d8;
  ImGuiRenderer *local_d0;
  undefined1 local_c8 [40];
  element_type *peStack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  long local_60;
  ImVec2 local_58;
  undefined8 uStack_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  
  local_d8 = command_buffer;
  local_d0 = this;
  iVar7 = (*(((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  local_c8._24_8_ = ImGui::GetDrawData();
  iVar12 = (int)((((ImDrawData *)local_c8._24_8_)->FramebufferScale).x *
                (((ImDrawData *)local_c8._24_8_)->DisplaySize).x);
  iVar14 = (int)((((ImDrawData *)local_c8._24_8_)->FramebufferScale).y *
                (((ImDrawData *)local_c8._24_8_)->DisplaySize).y);
  local_88 = (void *)CONCAT44(iVar14,iVar12);
  uStack_80 = 0;
  auVar17._0_4_ = -(uint)(0 < iVar12);
  auVar17._4_4_ = -(uint)(0 < iVar12);
  auVar17._8_4_ = -(uint)(0 < iVar14);
  auVar17._12_4_ = -(uint)(0 < iVar14);
  iVar12 = movmskpd(in_ECX,auVar17);
  if ((iVar12 == 3) && (lVar11 = (long)((ImDrawData *)local_c8._24_8_)->TotalVtxCount, lVar11 != 0))
  {
    psVar2 = (local_d0->m_vertex_buffers).
             super__Vector_base<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    this_00 = &psVar2[current_frame].super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>;
    this_03 = &(local_d0->m_index_buffers).
               super__Vector_base<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
               ._M_impl.super__Vector_impl_data._M_start[current_frame].
               super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>;
    lVar9 = (long)((ImDrawData *)local_c8._24_8_)->TotalIdxCount;
    peVar8 = psVar2[current_frame].super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar8 == (element_type *)0x0) ||
       ((uVar3 = (peVar8->super_BufferBase).m_size, uVar3 < (ulong)(lVar11 * 0x14) ||
        ((ulong)(lVar11 * 0x50) < uVar3)))) {
      local_c8._32_8_ = 0;
      peStack_a0 = (element_type *)0x0;
      local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Buffer::Create((Buffer *)local_c8,(Ptr<Device> *)CONCAT44(extraout_var,iVar7),lVar11 * 0x28,
                     0x804,0x80,VMA_MEMORY_USAGE_AUTO,
                     (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                      *)(local_c8 + 0x20));
      std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_00,(__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
      std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
      ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
               *)(local_c8 + 0x20));
    }
    peVar8 = this_03->_M_ptr;
    if (((peVar8 == (element_type *)0x0) ||
        (uVar3 = (peVar8->super_BufferBase).m_size, uVar3 < (ulong)(lVar9 * 2))) ||
       ((ulong)(lVar9 * 8) < uVar3)) {
      local_c8._32_8_ = 0;
      peStack_a0 = (element_type *)0x0;
      local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Buffer::Create((Buffer *)local_c8,(Ptr<Device> *)CONCAT44(extraout_var,iVar7),lVar9 << 2,0x804
                     ,0x40,VMA_MEMORY_USAGE_AUTO,
                     (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                      *)(local_c8 + 0x20));
      std::__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (this_03,(__shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2> *)local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
      std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
      ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
               *)(local_c8 + 0x20));
      peVar8 = this_03->_M_ptr;
    }
    pIVar10 = (ImDrawData *)local_c8._24_8_;
    __dest = this_00->_M_ptr->m_mapped_ptr;
    __dest_00 = peVar8->m_mapped_ptr;
    for (lVar11 = 0; lVar11 < *(int *)((long)pIVar10 + 4); lVar11 = lVar11 + 1) {
      pIVar4 = (*(ImDrawList ***)((long)pIVar10 + 0x10))[lVar11];
      lVar9 = (long)(pIVar4->VtxBuffer).Size;
      if (lVar9 != 0) {
        memmove(__dest,(pIVar4->VtxBuffer).Data,lVar9 * 0x14);
      }
      lVar9 = (long)(pIVar4->IdxBuffer).Size;
      if (lVar9 == 0) {
        lVar9 = 0;
      }
      else {
        memmove(__dest_00,(pIVar4->IdxBuffer).Data,lVar9 * 2);
        lVar9 = (long)(pIVar4->IdxBuffer).Size;
      }
      __dest = (void *)((long)__dest + (long)(pIVar4->VtxBuffer).Size * 0x14);
      __dest_00 = (void *)((long)__dest_00 + lVar9 * 2);
    }
    local_78._4_4_ = local_88._4_4_;
    local_78._0_4_ = local_88._4_4_;
    local_78._8_4_ = local_88._4_4_;
    local_78._12_4_ = local_88._4_4_;
    local_c8._20_4_ = (float)local_88;
    local_c8._16_4_ = local_88._4_4_;
    setup_render_state(local_d0,local_d8,(int)(float)local_88,local_88._4_4_,current_frame);
    local_48 = *(ImVec2 *)((long)pIVar10 + 0x18);
    uStack_40 = 0;
    local_58 = *(ImVec2 *)((long)pIVar10 + 0x28);
    uStack_50 = 0;
    local_88 = (void *)CONCAT44((float)local_88._4_4_,(float)(int)(float)local_88);
    uStack_80 = CONCAT44((float)uStack_80._4_4_,(float)(int)uStack_80);
    local_78._0_4_ = (undefined4)(int)local_78._0_4_;
    local_78._4_4_ = (undefined4)(int)local_78._4_4_;
    local_78._8_4_ = (undefined4)(int)local_78._8_4_;
    local_78._12_4_ = (undefined4)(int)local_78._12_4_;
    this_01 = (_Vector_base<VkRect2D,_std::allocator<VkRect2D>_> *)(local_c8 + 0x20);
    local_e4 = 0;
    local_e8 = 0;
    for (local_60 = 0; local_60 < pIVar10->CmdListsCount; local_60 = local_60 + 1) {
      pIVar4 = pIVar10->CmdLists[local_60];
      lVar9 = 0;
      for (lVar11 = 0; lVar11 < (pIVar4->CmdBuffer).Size; lVar11 = lVar11 + 1) {
        pIVar5 = (pIVar4->CmdBuffer).Data;
        pcVar6 = *(code **)((long)&pIVar5->UserCallback + lVar9);
        if (pcVar6 == (code *)0x0) {
          uVar1 = *(undefined8 *)((long)&(pIVar5->ClipRect).x + lVar9);
          auVar13._0_4_ = ((float)uVar1 - local_48.x) * local_58.x;
          auVar13._4_4_ = ((float)((ulong)uVar1 >> 0x20) - local_48.y) * local_58.y;
          auVar13._8_4_ = (0.0 - (float)uStack_40) * (float)uStack_50;
          auVar13._12_4_ = (0.0 - uStack_40._4_4_) * uStack_50._4_4_;
          if (auVar13._0_4_ < (float)local_88) {
            if (auVar13._4_4_ < (float)local_78._0_4_) {
              uVar1 = *(undefined8 *)((long)&(pIVar5->ClipRect).z + lVar9);
              fVar15 = ((float)uVar1 - local_48.x) * local_58.x;
              fVar16 = ((float)((ulong)uVar1 >> 0x20) - local_48.y) * local_58.y;
              if ((0.0 <= fVar15) && (0.0 <= fVar16)) {
                this_02 = (local_d8->
                          super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr;
                auVar17 = maxps(ZEXT816(0),auVar13);
                local_c8._0_4_ = (int)auVar17._0_4_;
                local_c8._4_4_ = (int)auVar17._4_4_;
                fVar15 = fVar15 - auVar17._0_4_;
                fVar16 = fVar16 - auVar17._4_4_;
                local_c8._8_4_ = (undefined4)fVar15;
                local_c8._12_4_ = (undefined4)fVar16;
                local_c8._8_4_ =
                     (int)(fVar15 - 2.1474836e+09) & (int)local_c8._8_4_ >> 0x1f | local_c8._8_4_;
                local_c8._12_4_ =
                     (int)(fVar16 - 2.1474836e+09) & (int)local_c8._12_4_ >> 0x1f | local_c8._12_4_;
                __l._M_len = 1;
                __l._M_array = (iterator)local_c8;
                std::vector<VkRect2D,_std::allocator<VkRect2D>_>::vector
                          ((vector<VkRect2D,_std::allocator<VkRect2D>_> *)this_01,__l,&local_d9);
                CommandBuffer::CmdSetScissor
                          (this_02,(vector<VkRect2D,_std::allocator<VkRect2D>_> *)this_01);
                std::_Vector_base<VkRect2D,_std::allocator<VkRect2D>_>::~_Vector_base(this_01);
                CommandBuffer::CmdDrawIndexed
                          ((local_d8->
                           super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr,*(uint32_t *)((long)&pIVar5->ElemCount + lVar9),1,
                           *(int *)((long)&pIVar5->IdxOffset + lVar9) + local_e4,
                           *(int *)((long)&pIVar5->VtxOffset + lVar9) + local_e8,0);
              }
            }
          }
        }
        else if (pcVar6 == (code *)0xffffffffffffffff) {
          setup_render_state(local_d0,local_d8,local_c8._20_4_,local_c8._16_4_,current_frame);
        }
        else {
          (*pcVar6)(pIVar4,(long)&(pIVar5->ClipRect).x + lVar9);
        }
        lVar9 = lVar9 + 0x38;
      }
      local_e4 = local_e4 + (pIVar4->IdxBuffer).Size;
      local_e8 = local_e8 + (pIVar4->VtxBuffer).Size;
      pIVar10 = (ImDrawData *)local_c8._24_8_;
    }
  }
  return;
}

Assistant:

void ImGuiRenderer::CmdDrawPipeline(const Ptr<CommandBuffer> &command_buffer, uint32_t current_frame) const {
	const Ptr<Device> &device = command_buffer->GetDevicePtr();

	ImDrawData *draw_data = ImGui::GetDrawData();

	int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
	int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
	if (fb_width <= 0 || fb_height <= 0 || draw_data->TotalVtxCount == 0)
		return;

	auto &vertex_buffer = m_vertex_buffers[current_frame];
	auto &index_buffer = m_index_buffers[current_frame];
	// Fill vertex buffer and index buffer
	{
		VkDeviceSize vertex_size = draw_data->TotalVtxCount * sizeof(ImDrawVert);
		VkDeviceSize index_size = draw_data->TotalIdxCount * sizeof(ImDrawIdx);
		if (!vertex_buffer || vertex_buffer->GetSize() < vertex_size || vertex_buffer->GetSize() > vertex_size * 4) {
			vertex_buffer =
			    Buffer::Create(device, vertex_size * 2,
			                   VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT | VMA_ALLOCATION_CREATE_MAPPED_BIT,
			                   VK_BUFFER_USAGE_VERTEX_BUFFER_BIT);
		}
		if (!index_buffer || index_buffer->GetSize() < index_size || index_buffer->GetSize() > index_size * 4) {
			index_buffer = Buffer::Create(
			    device, index_size * 2, VMA_ALLOCATION_CREATE_HOST_ACCESS_RANDOM_BIT | VMA_ALLOCATION_CREATE_MAPPED_BIT,
			    VK_BUFFER_USAGE_INDEX_BUFFER_BIT);
		}

		auto *vertex_ptr = (ImDrawVert *)vertex_buffer->GetMappedData();
		auto *index_ptr = (ImDrawIdx *)index_buffer->GetMappedData();
		for (int i = 0; i < draw_data->CmdListsCount; ++i) {
			const ImDrawList *cmd_list = draw_data->CmdLists[i];
			std::copy(cmd_list->VtxBuffer.begin(), cmd_list->VtxBuffer.end(), vertex_ptr);
			std::copy(cmd_list->IdxBuffer.begin(), cmd_list->IdxBuffer.end(), index_ptr);
			vertex_ptr += cmd_list->VtxBuffer.Size;
			index_ptr += cmd_list->IdxBuffer.Size;
		}
	}

	setup_render_state(command_buffer, fb_width, fb_height, current_frame);

	// Will project scissor/clipping rectangles into framebuffer space
	ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
	ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

	// Render command lists
	// (Because we merged all buffers into a single one, we maintain our own offset into them)
	int global_vtx_offset = 0;
	int global_idx_offset = 0;
	for (int n = 0; n < draw_data->CmdListsCount; n++) {
		const ImDrawList *cmd_list = draw_data->CmdLists[n];
		for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++) {
			const ImDrawCmd *pcmd = &cmd_list->CmdBuffer[cmd_i];
			if (pcmd->UserCallback) {
				// User callback, registered via ImDrawList::AddCallback()
				// (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer
				// to reset render state.)
				if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
					setup_render_state(command_buffer, fb_width, fb_height, current_frame);
				else
					pcmd->UserCallback(cmd_list, pcmd);
			} else {
				// Project scissor/clipping rectangles into framebuffer space
				ImVec4 clip_rect;
				clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
				clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
				clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
				clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

				if (clip_rect.x < (float)fb_width && clip_rect.y < (float)fb_height && clip_rect.z >= 0.0f &&
				    clip_rect.w >= 0.0f) {
					// Negative offsets are illegal for vkCmdSetScissor
					if (clip_rect.x < 0.0f)
						clip_rect.x = 0.0f;
					if (clip_rect.y < 0.0f)
						clip_rect.y = 0.0f;

					// Apply scissor/clipping rectangle
					VkRect2D scissor;
					scissor.offset.x = (int32_t)clip_rect.x;
					scissor.offset.y = (int32_t)clip_rect.y;
					scissor.extent.width = (uint32_t)(clip_rect.z - clip_rect.x);
					scissor.extent.height = (uint32_t)(clip_rect.w - clip_rect.y);
					command_buffer->CmdSetScissor({scissor});
					command_buffer->CmdDrawIndexed(pcmd->ElemCount, 1, pcmd->IdxOffset + global_idx_offset,
					                               pcmd->VtxOffset + global_vtx_offset, 0);
				}
			}
		}
		global_idx_offset += cmd_list->IdxBuffer.Size;
		global_vtx_offset += cmd_list->VtxBuffer.Size;
	}
}